

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O0

ExprBase *
AnalyzeVariableDefinition
          (ExpressionContext *ctx,SynVariableDefinition *syntax,uint alignment,TypeBase *type)

{
  InplaceStr *pIVar1;
  Allocator *allocator;
  ScopeData *pSVar2;
  SynBase *pSVar3;
  bool bVar4;
  uint uVar5;
  TypeBase *pTVar6;
  VariableData *this;
  SynIdentifier *pSVar7;
  ExprError *pEVar8;
  bool_type bVar9;
  TypeClass *pTVar10;
  VariableHandle *pVVar11;
  ExprVariableDefinition *this_00;
  TypeArray *pTVar12;
  ExprVariableAccess *pEVar13;
  TypeRef *pTVar14;
  ExprDereference *pEVar15;
  ExprFunctionAccess *pEVar16;
  ExprBase *pEVar17;
  ExprVariableAccess *this_01;
  char *in_R8;
  InplaceStr name;
  ExprFunctionAccess *local_1c8;
  ExprDereference *node_3;
  ExprVariableAccess *node_2;
  ExprBase *access_2;
  ExprBase *call;
  ExprBase *access_1;
  ExprDereference *node_1;
  ExprVariableAccess *node;
  TypeArray *arrType;
  ExprBase *access;
  TypeClass *classType;
  uint offset;
  TypeBase *parentType;
  FunctionValue bestOverload;
  TypeFunction *target;
  TypeBase *match;
  IntrusiveList<MatchData> aliases;
  IdentifierLookupResult local_a8;
  ExprFunctionAccess *local_98;
  ExprBase *initializer;
  char *local_88;
  VariableData *local_80;
  VariableData *variable;
  char *local_70;
  byte local_61;
  char *pcStack_60;
  bool conflict;
  char *local_58;
  undefined1 local_50 [8];
  InplaceStr fullName;
  TypeFunction *local_30;
  TypeBase *type_local;
  uint alignment_local;
  SynVariableDefinition *syntax_local;
  ExpressionContext *ctx_local;
  
  if (syntax->name == (SynIdentifier *)0x0) {
    ctx_local = (ExpressionContext *)ExpressionContext::get<ExprError>(ctx);
    pTVar6 = &ExpressionContext::GetErrorType(ctx)->super_TypeBase;
    ExprError::ExprError((ExprError *)ctx_local,&syntax->super_SynBase,pTVar6);
  }
  else {
    pSVar7 = syntax->name;
    InplaceStr::InplaceStr((InplaceStr *)&fullName.end,"this");
    bVar4 = InplaceStr::operator==(&pSVar7->name,(InplaceStr *)&fullName.end);
    if (bVar4) {
      anon_unknown.dwarf_6f1cc::Stop
                (ctx,&syntax->super_SynBase,"ERROR: \'this\' is a reserved keyword");
    }
    bVar4 = isType<TypeError>(type);
    if (bVar4) {
      if ((syntax->initializer == (SynBase *)0x0) || (ctx->scope->ownerType != (TypeBase *)0x0)) {
        ctx_local = (ExpressionContext *)ExpressionContext::get<ExprError>(ctx);
        pTVar6 = &ExpressionContext::GetErrorType(ctx)->super_TypeBase;
        ExprError::ExprError((ExprError *)ctx_local,&syntax->super_SynBase,pTVar6);
      }
      else {
        ctx_local = (ExpressionContext *)ExpressionContext::get<ExprError>(ctx);
        pTVar6 = &ExpressionContext::GetErrorType(ctx)->super_TypeBase;
        pEVar17 = AnalyzeExpression(ctx,syntax->initializer);
        ExprError::ExprError((ExprError *)ctx_local,&syntax->super_SynBase,pTVar6,pEVar17);
      }
    }
    else {
      pIVar1 = &syntax->name->name;
      pcStack_60 = pIVar1->begin;
      local_58 = (syntax->name->name).end;
      _local_50 = GetVariableNameInScope(ctx,ctx->scope,*pIVar1);
      variable = (VariableData *)local_50;
      local_70 = fullName.begin;
      name.end = in_R8;
      name.begin = fullName.begin;
      local_61 = anon_unknown.dwarf_6f1cc::CheckVariableConflict
                           ((anon_unknown_dwarf_6f1cc *)ctx,(ExpressionContext *)syntax,
                            (SynBase *)local_50,name);
      this = ExpressionContext::get<VariableData>(ctx);
      allocator = ctx->allocator;
      pSVar2 = ctx->scope;
      pSVar7 = ExpressionContext::get<SynIdentifier>(ctx);
      initializer = (ExprBase *)local_50;
      local_88 = fullName.begin;
      SynIdentifier::SynIdentifier(pSVar7,syntax->name,_local_50);
      uVar5 = ctx->uniqueVariableId;
      ctx->uniqueVariableId = uVar5 + 1;
      VariableData::VariableData(this,allocator,&syntax->super_SynBase,pSVar2,0,type,pSVar7,0,uVar5)
      ;
      local_80 = this;
      bVar4 = anon_unknown.dwarf_6f1cc::IsLookupOnlyVariable(ctx,this);
      if (bVar4) {
        local_80->lookupOnly = true;
      }
      if ((local_61 & 1) == 0) {
        ExpressionContext::AddVariable(ctx,local_80,true);
      }
      if ((syntax->initializer == (SynBase *)0x0) || (local_80->scope->ownerType != (TypeBase *)0x0)
         ) {
        local_1c8 = (ExprFunctionAccess *)0x0;
      }
      else {
        local_1c8 = (ExprFunctionAccess *)AnalyzeExpression(ctx,syntax->initializer);
      }
      local_98 = local_1c8;
      if (type == ctx->typeAuto) {
        if (local_80->scope->ownerType != (TypeBase *)0x0) {
          pTVar6 = &ExpressionContext::GetErrorType(ctx)->super_TypeBase;
          pEVar8 = anon_unknown.dwarf_6f1cc::ReportExpected
                             (ctx,&syntax->super_SynBase,pTVar6,
                              "ERROR: member variable type cannot be \'auto\'");
          return &pEVar8->super_ExprBase;
        }
        local_98 = (ExprFunctionAccess *)
                   ResolveInitializerValue(ctx,&syntax->super_SynBase,&local_1c8->super_ExprBase);
        bVar4 = isType<TypeError>((local_98->super_ExprBase).type);
        if (bVar4) {
          if ((local_61 & 1) == 0) {
            pSVar2 = ctx->scope;
            uVar5 = local_80->nameHash;
            IdentifierLookupResult::IdentifierLookupResult(&local_a8,local_80);
            DirectChainedMap<IdentifierLookupResult>::remove
                      (&pSVar2->idLookupMap,(char *)(ulong)uVar5);
          }
          pEVar8 = ExpressionContext::get<ExprError>(ctx);
          pTVar6 = &ExpressionContext::GetErrorType(ctx)->super_TypeBase;
          ExprError::ExprError(pEVar8,&syntax->super_SynBase,pTVar6,&local_98->super_ExprBase);
          return &pEVar8->super_ExprBase;
        }
        local_30 = (TypeFunction *)(local_98->super_ExprBase).type;
      }
      else if (((type->isGeneric & 1U) == 0) || (local_1c8 == (ExprFunctionAccess *)0x0)) {
        local_30 = (TypeFunction *)type;
        if ((type->isGeneric & 1U) != 0) {
          if (local_80->scope->ownerType != (TypeBase *)0x0) {
            pTVar6 = &ExpressionContext::GetErrorType(ctx)->super_TypeBase;
            pEVar8 = anon_unknown.dwarf_6f1cc::ReportExpected
                               (ctx,&syntax->super_SynBase,pTVar6,
                                "ERROR: member variable type cannot be \'%.*s\'",
                                (ulong)(uint)((int)(type->name).end - (int)(type->name).begin),
                                (type->name).begin);
            return &pEVar8->super_ExprBase;
          }
          anon_unknown.dwarf_6f1cc::Stop
                    (ctx,&syntax->super_SynBase,
                     "ERROR: initializer is required to resolve generic type \'%.*s\'",
                     (ulong)(uint)((int)(type->name).end - (int)(type->name).begin));
        }
      }
      else {
        bVar4 = isType<TypeError>((local_1c8->super_ExprBase).type);
        if (bVar4) {
          if ((local_61 & 1) == 0) {
            pSVar2 = ctx->scope;
            uVar5 = local_80->nameHash;
            IdentifierLookupResult::IdentifierLookupResult
                      ((IdentifierLookupResult *)&aliases.tail,local_80);
            DirectChainedMap<IdentifierLookupResult>::remove
                      (&pSVar2->idLookupMap,(char *)(ulong)uVar5);
          }
          pEVar8 = ExpressionContext::get<ExprError>(ctx);
          pTVar6 = &ExpressionContext::GetErrorType(ctx)->super_TypeBase;
          ExprError::ExprError(pEVar8,&syntax->super_SynBase,pTVar6,&local_98->super_ExprBase);
          return &pEVar8->super_ExprBase;
        }
        IntrusiveList<MatchData>::IntrusiveList((IntrusiveList<MatchData> *)&match);
        target = (TypeFunction *)
                 MatchGenericType(ctx,&syntax->super_SynBase,type,(local_98->super_ExprBase).type,
                                  (IntrusiveList<MatchData> *)&match,true);
        if ((target == (TypeFunction *)0x0) || (((target->super_TypeBase).isGeneric & 1U) != 0)) {
          anon_unknown.dwarf_6f1cc::Stop
                    (ctx,&syntax->super_SynBase,
                     "ERROR: can\'t resolve generic type \'%.*s\' instance for \'%.*s\'",
                     (ulong)(uint)((int)(((local_98->super_ExprBase).type)->name).end -
                                  (int)(((local_98->super_ExprBase).type)->name).begin),
                     (((local_98->super_ExprBase).type)->name).begin,
                     (ulong)(uint)((int)(type->name).end - (int)(type->name).begin),
                     (type->name).begin);
        }
        bestOverload.context = (ExprBase *)getType<TypeFunction>((TypeBase *)target);
        if (((TypeFunction *)bestOverload.context != (TypeFunction *)0x0) &&
           (bVar4 = isType<TypeAuto>(((TypeFunction *)bestOverload.context)->returnType), bVar4)) {
          GetFunctionForType((FunctionValue *)&parentType,ctx,(local_98->super_ExprBase).source,
                             &local_98->super_ExprBase,(TypeFunction *)bestOverload.context);
          bVar9 = FunctionValue::operator_cast_to_function_pointer((FunctionValue *)&parentType);
          if (bVar9 != 0) {
            pEVar16 = ExpressionContext::get<ExprFunctionAccess>(ctx);
            ExprFunctionAccess::ExprFunctionAccess
                      (pEVar16,(SynBase *)parentType,(TypeBase *)((bestOverload.source)->pos).end,
                       (FunctionData *)bestOverload.source,(ExprBase *)bestOverload.function);
            target = (TypeFunction *)((bestOverload.source)->pos).end;
            local_98 = pEVar16;
          }
        }
        local_30 = target;
      }
      type_local._4_4_ = alignment;
      if (alignment == 0) {
        pTVar6 = ctx->scope->ownerType;
        if (((pTVar6 == (TypeBase *)0x0) || (pTVar6->alignment == 0)) ||
           ((local_30->super_TypeBase).alignment <= pTVar6->alignment)) {
          type_local._4_4_ = (local_30->super_TypeBase).alignment;
        }
        else {
          type_local._4_4_ = pTVar6->alignment;
        }
      }
      uVar5 = anon_unknown.dwarf_6f1cc::AllocateVariableInScope
                        (ctx,&syntax->super_SynBase,type_local._4_4_,&local_30->super_TypeBase);
      local_80->type = &local_30->super_TypeBase;
      local_80->alignment = type_local._4_4_;
      local_80->offset = uVar5;
      pTVar10 = getType<TypeClass>(local_80->type);
      if ((pTVar10 != (TypeClass *)0x0) && ((pTVar10->hasFinalizer & 1U) != 0)) {
        anon_unknown.dwarf_6f1cc::Stop
                  (ctx,&syntax->super_SynBase,
                   "ERROR: cannot create \'%.*s\' that implements \'finalize\' on stack",
                   (ulong)(uint)((int)(pTVar10->super_TypeStruct).super_TypeBase.name.end -
                                (int)(pTVar10->super_TypeStruct).super_TypeBase.name.begin));
      }
      if (local_80->scope->ownerType == (TypeBase *)0x0) {
        if (local_98 == (ExprFunctionAccess *)0x0) {
          bVar4 = HasDefaultConstructor(ctx,&syntax->super_SynBase,local_80->type);
          if (bVar4) {
            pEVar17 = CreateVariableAccess(ctx,&syntax->name->super_SynBase,local_80,true);
            pTVar6 = local_80->type;
            pEVar17 = CreateGetAddress(ctx,&syntax->super_SynBase,pEVar17);
            pEVar16 = (ExprFunctionAccess *)
                      CreateDefaultConstructorCall(ctx,&syntax->super_SynBase,pTVar6,pEVar17);
            if (pEVar16 != (ExprFunctionAccess *)0x0) {
              local_98 = pEVar16;
            }
          }
          else if (((ctx->scope != ctx->globalScope) &&
                   (ctx->scope->ownerNamespace == (NamespaceData *)0x0)) &&
                  (local_80->type->size != 0)) {
            node_2 = (ExprVariableAccess *)
                     CreateVariableAccess(ctx,&syntax->name->super_SynBase,local_80,true);
            pEVar13 = getType<ExprVariableAccess>((ExprBase *)node_2);
            if (pEVar13 == (ExprVariableAccess *)0x0) {
              pEVar15 = getType<ExprDereference>((ExprBase *)node_2);
              if (pEVar15 != (ExprDereference *)0x0) {
                node_2 = (ExprVariableAccess *)pEVar15->value;
              }
            }
            else {
              this_01 = (ExprVariableAccess *)ExpressionContext::get<ExprGetAddress>(ctx);
              pSVar3 = (node_2->super_ExprBase).source;
              pTVar14 = ExpressionContext::GetReferenceType(ctx,(node_2->super_ExprBase).type);
              pVVar11 = ExpressionContext::get<VariableHandle>(ctx);
              VariableHandle::VariableHandle
                        (pVVar11,(pEVar13->super_ExprBase).source,pEVar13->variable);
              ExprGetAddress::ExprGetAddress
                        ((ExprGetAddress *)this_01,pSVar3,&pTVar14->super_TypeBase,pVVar11);
              node_2 = this_01;
            }
            pEVar16 = (ExprFunctionAccess *)ExpressionContext::get<ExprZeroInitialize>(ctx);
            ExprZeroInitialize::ExprZeroInitialize
                      ((ExprZeroInitialize *)pEVar16,syntax->initializer,ctx->typeVoid,
                       &node_2->super_ExprBase);
            local_98 = pEVar16;
          }
        }
        else {
          bVar4 = isType<TypeError>((local_98->super_ExprBase).type);
          if (bVar4) {
            this_00 = ExpressionContext::get<ExprVariableDefinition>(ctx);
            pTVar6 = ctx->typeVoid;
            pVVar11 = ExpressionContext::get<VariableHandle>(ctx);
            VariableHandle::VariableHandle(pVVar11,&syntax->name->super_SynBase,local_80);
            ExprVariableDefinition::ExprVariableDefinition
                      (this_00,&syntax->super_SynBase,pTVar6,pVVar11,&local_98->super_ExprBase);
            return &this_00->super_ExprBase;
          }
          arrType = (TypeArray *)
                    CreateVariableAccess(ctx,&syntax->name->super_SynBase,local_80,true);
          pTVar12 = getType<TypeArray>(local_80->type);
          if ((((pTVar12 == (TypeArray *)0x0) ||
               (bVar4 = isType<TypeArray>((local_98->super_ExprBase).type), bVar4)) ||
              ((TypeStruct *)(local_98->super_ExprBase).type == ctx->typeAutoArray)) ||
             ((TypeStruct *)(local_98->super_ExprBase).type == ctx->typeAutoRef)) {
            local_98 = (ExprFunctionAccess *)
                       CreateAssignment(ctx,syntax->initializer,(ExprBase *)arrType,
                                        &local_98->super_ExprBase);
          }
          else {
            local_98 = (ExprFunctionAccess *)
                       CreateCast(ctx,syntax->initializer,&local_98->super_ExprBase,pTVar12->subType
                                  ,false);
            pEVar13 = getType<ExprVariableAccess>((ExprBase *)arrType);
            if (pEVar13 == (ExprVariableAccess *)0x0) {
              pEVar15 = getType<ExprDereference>((ExprBase *)arrType);
              if (pEVar15 != (ExprDereference *)0x0) {
                arrType = (TypeArray *)pEVar15->value;
              }
            }
            else {
              pTVar12 = (TypeArray *)ExpressionContext::get<ExprGetAddress>(ctx);
              pSVar3 = (SynBase *)(arrType->super_TypeBase).name.begin;
              pTVar14 = ExpressionContext::GetReferenceType
                                  (ctx,(TypeBase *)(arrType->super_TypeBase).name.end);
              pVVar11 = ExpressionContext::get<VariableHandle>(ctx);
              VariableHandle::VariableHandle
                        (pVVar11,(pEVar13->super_ExprBase).source,pEVar13->variable);
              ExprGetAddress::ExprGetAddress
                        ((ExprGetAddress *)pTVar12,pSVar3,&pTVar14->super_TypeBase,pVVar11);
              arrType = pTVar12;
            }
            pEVar16 = (ExprFunctionAccess *)ExpressionContext::get<ExprArraySetup>(ctx);
            ExprArraySetup::ExprArraySetup
                      ((ExprArraySetup *)pEVar16,syntax->initializer,ctx->typeVoid,
                       (ExprBase *)arrType,&local_98->super_ExprBase);
            local_98 = pEVar16;
          }
        }
        ctx_local = (ExpressionContext *)ExpressionContext::get<ExprVariableDefinition>(ctx);
        pTVar6 = ctx->typeVoid;
        pVVar11 = ExpressionContext::get<VariableHandle>(ctx);
        VariableHandle::VariableHandle(pVVar11,&syntax->name->super_SynBase,local_80);
        ExprVariableDefinition::ExprVariableDefinition
                  ((ExprVariableDefinition *)ctx_local,&syntax->super_SynBase,pTVar6,pVVar11,
                   &local_98->super_ExprBase);
      }
      else {
        ctx_local = (ExpressionContext *)ExpressionContext::get<ExprVariableDefinition>(ctx);
        pTVar6 = ctx->typeVoid;
        pVVar11 = ExpressionContext::get<VariableHandle>(ctx);
        VariableHandle::VariableHandle(pVVar11,&syntax->name->super_SynBase,local_80);
        ExprVariableDefinition::ExprVariableDefinition
                  ((ExprVariableDefinition *)ctx_local,&syntax->super_SynBase,pTVar6,pVVar11,
                   (ExprBase *)0x0);
      }
    }
  }
  return (ExprBase *)ctx_local;
}

Assistant:

ExprBase* AnalyzeVariableDefinition(ExpressionContext &ctx, SynVariableDefinition *syntax, unsigned alignment, TypeBase *type)
{
	if(!syntax->name)
		return new (ctx.get<ExprError>()) ExprError(syntax, ctx.GetErrorType());

	if(syntax->name->name == InplaceStr("this"))
		Stop(ctx, syntax, "ERROR: 'this' is a reserved keyword");

	if(isType<TypeError>(type))
	{
		if(syntax->initializer && !ctx.scope->ownerType)
			return new (ctx.get<ExprError>()) ExprError(syntax, ctx.GetErrorType(), AnalyzeExpression(ctx, syntax->initializer));

		return new (ctx.get<ExprError>()) ExprError(syntax, ctx.GetErrorType());
	}

	InplaceStr fullName = GetVariableNameInScope(ctx, ctx.scope, syntax->name->name);

	bool conflict = CheckVariableConflict(ctx, syntax, fullName);

	VariableData *variable = new (ctx.get<VariableData>()) VariableData(ctx.allocator, syntax, ctx.scope, 0, type, new (ctx.get<SynIdentifier>()) SynIdentifier(syntax->name, fullName), 0, ctx.uniqueVariableId++);

	if (IsLookupOnlyVariable(ctx, variable))
		variable->lookupOnly = true;

	if(!conflict)
		ctx.AddVariable(variable, true);

	ExprBase *initializer = syntax->initializer && !variable->scope->ownerType ? AnalyzeExpression(ctx, syntax->initializer) : NULL;

	if(type == ctx.typeAuto)
	{
		if(variable->scope->ownerType)
			return ReportExpected(ctx, syntax, ctx.GetErrorType(), "ERROR: member variable type cannot be 'auto'");

		initializer = ResolveInitializerValue(ctx, syntax, initializer);

		if(isType<TypeError>(initializer->type))
		{
			if(!conflict)
				ctx.scope->idLookupMap.remove(variable->nameHash, IdentifierLookupResult(variable));

			return new (ctx.get<ExprError>()) ExprError(syntax, ctx.GetErrorType(), initializer);
		}

		type = initializer->type;
	}
	else if(type->isGeneric && initializer)
	{
		if(isType<TypeError>(initializer->type))
		{
			if(!conflict)
				ctx.scope->idLookupMap.remove(variable->nameHash, IdentifierLookupResult(variable));

			return new (ctx.get<ExprError>()) ExprError(syntax, ctx.GetErrorType(), initializer);
		}

		IntrusiveList<MatchData> aliases;

		TypeBase *match = MatchGenericType(ctx, syntax, type, initializer->type, aliases, true);

		if(!match || match->isGeneric)
			Stop(ctx, syntax, "ERROR: can't resolve generic type '%.*s' instance for '%.*s'", FMT_ISTR(initializer->type->name), FMT_ISTR(type->name));

		// If initiallizer is a generic function and the matched function type return type is unknown, we have to instantiate the function here to find the actual return type
		if(TypeFunction *target = getType<TypeFunction>(match))
		{
			if(isType<TypeAuto>(target->returnType))
			{
				if(FunctionValue bestOverload = GetFunctionForType(ctx, initializer->source, initializer, target))
				{
					initializer = new (ctx.get<ExprFunctionAccess>()) ExprFunctionAccess(bestOverload.source, bestOverload.function->type, bestOverload.function, bestOverload.context);

					match = bestOverload.function->type;
				}
			}
		}

		type = match;
	}
	else if(type->isGeneric)
	{
		if(variable->scope->ownerType)
			return ReportExpected(ctx, syntax, ctx.GetErrorType(), "ERROR: member variable type cannot be '%.*s'", FMT_ISTR(type->name));

		Stop(ctx, syntax, "ERROR: initializer is required to resolve generic type '%.*s'", FMT_ISTR(type->name));
	}

	if(alignment == 0)
	{
		TypeBase *parentType = ctx.scope->ownerType;

		if(parentType && parentType->alignment != 0 && parentType->alignment < type->alignment)
			alignment = parentType->alignment;
		else
			alignment = type->alignment;
	}

	// Fixup variable data not that the final type is known
	unsigned offset = AllocateVariableInScope(ctx, syntax, alignment, type);
	
	variable->type = type;
	variable->alignment = alignment;
	variable->offset = offset;

	if(TypeClass *classType = getType<TypeClass>(variable->type))
	{
		if(classType->hasFinalizer)
			Stop(ctx, syntax, "ERROR: cannot create '%.*s' that implements 'finalize' on stack", FMT_ISTR(classType->name));
	}

	if(variable->scope->ownerType)
		return new (ctx.get<ExprVariableDefinition>()) ExprVariableDefinition(syntax, ctx.typeVoid, new (ctx.get<VariableHandle>()) VariableHandle(syntax->name, variable), NULL);

	if(initializer)
	{
		if(isType<TypeError>(initializer->type))
			return new (ctx.get<ExprVariableDefinition>()) ExprVariableDefinition(syntax, ctx.typeVoid, new (ctx.get<VariableHandle>()) VariableHandle(syntax->name, variable), initializer);

		ExprBase *access = CreateVariableAccess(ctx, syntax->name, variable, true);

		TypeArray *arrType = getType<TypeArray>(variable->type);

		// Single-level array might be set with a single element at the point of definition
		if(arrType && !isType<TypeArray>(initializer->type) && initializer->type != ctx.typeAutoArray && initializer->type != ctx.typeAutoRef)
		{
			initializer = CreateCast(ctx, syntax->initializer, initializer, arrType->subType, false);

			if(ExprVariableAccess *node = getType<ExprVariableAccess>(access))
				access = new (ctx.get<ExprGetAddress>()) ExprGetAddress(access->source, ctx.GetReferenceType(access->type), new (ctx.get<VariableHandle>()) VariableHandle(node->source, node->variable));
			else if(ExprDereference *node = getType<ExprDereference>(access))
				access = node->value;

			initializer = new (ctx.get<ExprArraySetup>()) ExprArraySetup(syntax->initializer, ctx.typeVoid, access, initializer);
		}
		else
		{
			initializer = CreateAssignment(ctx, syntax->initializer, access, initializer);
		}
	}
	else if(HasDefaultConstructor(ctx, syntax, variable->type))
	{
		ExprBase *access = CreateVariableAccess(ctx, syntax->name, variable, true);

		if(ExprBase *call = CreateDefaultConstructorCall(ctx, syntax, variable->type, CreateGetAddress(ctx, syntax, access)))
			initializer = call;
	}
	else if(ctx.scope != ctx.globalScope && ctx.scope->ownerNamespace == NULL && variable->type->size != 0)
	{
		ExprBase *access = CreateVariableAccess(ctx, syntax->name, variable, true);

		if(ExprVariableAccess *node = getType<ExprVariableAccess>(access))
			access = new (ctx.get<ExprGetAddress>()) ExprGetAddress(access->source, ctx.GetReferenceType(access->type), new (ctx.get<VariableHandle>()) VariableHandle(node->source, node->variable));
		else if(ExprDereference *node = getType<ExprDereference>(access))
			access = node->value;

		initializer = new (ctx.get<ExprZeroInitialize>()) ExprZeroInitialize(syntax->initializer, ctx.typeVoid, access);
	}

	return new (ctx.get<ExprVariableDefinition>()) ExprVariableDefinition(syntax, ctx.typeVoid, new (ctx.get<VariableHandle>()) VariableHandle(syntax->name, variable), initializer);
}